

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_ValueComp_Test::Btree_ValueComp_Test(Btree_ValueComp_Test *this)

{
  Btree_ValueComp_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Btree_ValueComp_Test_0079b108;
  return;
}

Assistant:

TEST(Btree, ValueComp) {
        phmap::btree_set<int> s;
        EXPECT_TRUE(s.value_comp()(1, 2));
        EXPECT_FALSE(s.value_comp()(2, 2));
        EXPECT_FALSE(s.value_comp()(2, 1));

        phmap::btree_map<int, int> m1;
        EXPECT_TRUE(m1.value_comp()(std::make_pair(1, 0), std::make_pair(2, 0)));
        EXPECT_FALSE(m1.value_comp()(std::make_pair(2, 0), std::make_pair(2, 0)));
        EXPECT_FALSE(m1.value_comp()(std::make_pair(2, 0), std::make_pair(1, 0)));

        phmap::btree_map<std::string, int> m2;
        EXPECT_TRUE(Identity(
                        m2.value_comp()(std::make_pair("a", 0), std::make_pair("b", 0)) < 0));
        EXPECT_TRUE(Identity(
                        m2.value_comp()(std::make_pair("b", 0), std::make_pair("b", 0)) == 0));
        EXPECT_TRUE(Identity(
                        m2.value_comp()(std::make_pair("b", 0), std::make_pair("a", 0)) > 0));
    }